

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalarestimator.cxx
# Opt level: O3

void __thiscall ScalarEstimator::estimate(ScalarEstimator *this,double d)

{
  uint *puVar1;
  uint uVar2;
  double dVar3;
  
  puVar1 = &(this->super_Estimator).nSamples;
  *puVar1 = *puVar1 + 1;
  uVar2 = (this->super_Estimator).nEstimate;
  if ((uVar2 & 1) != 0) {
    this->dSample = d;
  }
  if ((uVar2 & 4) != 0) {
    this->dOne = this->dOne + d;
  }
  if ((uVar2 & 8) != 0) {
    this->dTwo = d * d + this->dTwo;
  }
  if ((uVar2 & 0x10) != 0) {
    this->dThree = d * d * d + this->dThree;
  }
  if ((uVar2 & 2) != 0) {
    dVar3 = floor((d - this->dDistOffset) / this->dDistScale + 0.5);
    uVar2 = (uint)dVar3;
    if (-1 < (int)uVar2 && (int)uVar2 <= this->nDist) {
      this->aDist[uVar2] = this->aDist[uVar2] + 1.0;
    }
  }
  return;
}

Assistant:

void ScalarEstimator::estimate(double d)
{
	++nSamples;
	
	// record moments
	if(nEstimate & EST_SAMPLE)
		dSample = d;
	if(nEstimate & EST_MEAN)
		dOne += d;
	if(nEstimate & EST_VAR)
		dTwo += d*d;
	if(nEstimate & EST_CUR)
		dThree += d*d*d;

	// record density
	if(nEstimate & EST_DENS) {
		int bin = (int) floor( (d - dDistOffset) / dDistScale + 0.5); // round
		if( (bin <= nDist) && (bin >= 0) ) {
			aDist[ bin ]++;
		} else {
			;
		}
	}
}